

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

void reset_rndmonst(int mndx)

{
  int mndx_local;
  
  if (mndx == -1) {
    rndmonst_state.choice_count = -1;
  }
  else if (mndx < 0x158) {
    rndmonst_state.choice_count = rndmonst_state.choice_count - rndmonst_state.mchoices[mndx];
    rndmonst_state.mchoices[mndx] = '\0';
  }
  return;
}

Assistant:

void reset_rndmonst(int mndx)
{
	/* cached selection info is out of date */
	if (mndx == NON_PM) {
	    rndmonst_state.choice_count = -1;	/* full recalc needed */
	} else if (mndx < SPECIAL_PM) {
	    rndmonst_state.choice_count -= rndmonst_state.mchoices[mndx];
	    rndmonst_state.mchoices[mndx] = 0;
	} /* note: safe to ignore extinction of unique monsters */
}